

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

Value * __thiscall Json::Value::operator=(Value *this,Value *other)

{
  swap(this,other);
  return this;
}

Assistant:

Value& Value::operator=(Value other) {
  swap(other);
  return *this;
}